

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O3

bool __thiscall AInventory::CanPickup(AInventory *this,AActor *toucher)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  undefined4 extraout_var_01;
  PClass *pPVar5;
  ulong uVar6;
  bool bVar7;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  if (toucher == (AActor *)0x0) {
    return false;
  }
  pPVar3 = (this->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(this->super_AActor).super_DThinker.super_DObject._vptr_DObject)(this);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (this->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
  }
  if (*(int *)((long)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                      super_DObject.GCNext + 4) == 0) {
    if (*(int *)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.field_0x2c
        == 0) {
      bVar7 = true;
    }
    else {
      pPVar4 = (toucher->super_DThinker).super_DObject.Class;
      uVar6 = 0;
      do {
        pPVar1 = *(PClass **)
                  (*(long *)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.
                             super_PType.super_DObject.ObjectFlags + uVar6 * 8);
        if (pPVar4 == (PClass *)0x0) {
          iVar2 = (**(toucher->super_DThinker).super_DObject._vptr_DObject)(toucher);
          pPVar4 = (PClass *)CONCAT44(extraout_var_01,iVar2);
          (toucher->super_DThinker).super_DObject.Class = pPVar4;
        }
        bVar7 = pPVar4 != (PClass *)0x0;
        pPVar5 = pPVar4;
        if (pPVar4 != pPVar1 && bVar7) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar7 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar1) break;
          } while (pPVar5 != (PClass *)0x0);
        }
      } while ((bVar7 == false) &&
              (uVar6 = uVar6 + 1,
              uVar6 < *(uint *)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.
                                super_PType.field_0x2c));
      bVar7 = (bool)(bVar7 ^ 1);
    }
  }
  else {
    pPVar4 = (toucher->super_DThinker).super_DObject.Class;
    uVar6 = 0;
    do {
      pPVar1 = (PClass *)
               (&(pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
                  super_DObject.ObjNext)->_vptr_DObject)[uVar6];
      if (pPVar4 == (PClass *)0x0) {
        iVar2 = (**(toucher->super_DThinker).super_DObject._vptr_DObject)(toucher);
        pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
        (toucher->super_DThinker).super_DObject.Class = pPVar4;
      }
      bVar7 = pPVar4 != (PClass *)0x0;
      pPVar5 = pPVar4;
      if (pPVar4 != pPVar1 && bVar7) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar7 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar1) break;
        } while (pPVar5 != (PClass *)0x0);
      }
    } while ((bVar7 == false) &&
            (uVar6 = uVar6 + 1,
            uVar6 < *(uint *)((long)&pPVar3[2].super_PStruct.super_PNamedType.super_PCompoundType.
                                     super_PType.super_DObject.GCNext + 4)));
  }
  return bVar7;
}

Assistant:

bool AInventory::CanPickup (AActor *toucher)
{
	if (!toucher)
		return false;

	PClassInventory *ai = GetClass();
	// Is the item restricted to certain player classes?
	if (ai->RestrictedToPlayerClass.Size() != 0)
	{
		for (unsigned i = 0; i < ai->RestrictedToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->RestrictedToPlayerClass[i]))
				return true;
		}
		return false;
	}
	// Or is it forbidden to certain other classes?
	else
	{
		for (unsigned i = 0; i < ai->ForbiddenToPlayerClass.Size(); ++i)
		{
			if (toucher->IsKindOf(ai->ForbiddenToPlayerClass[i]))
				return false;
		}
	}
	return true;
}